

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection.cpp
# Opt level: O2

void duckdb::ColumnDataCopyArray
               (ColumnDataMetaData *meta_data,UnifiedVectorFormat *source_data,Vector *source,
               idx_t offset,idx_t copy_count)

{
  ColumnDataCollectionSegment *this;
  sel_t *psVar1;
  bool bVar2;
  Vector *this_00;
  idx_t iVar3;
  VectorMetaData *pVVar4;
  VectorDataIndex index;
  VectorChildIndex VVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  idx_t i;
  idx_t iVar9;
  idx_t iVar10;
  idx_t iVar11;
  ColumnDataMetaData local_a8;
  UnifiedVectorFormat child_vector_data;
  
  this = meta_data->segment;
  TemplatedColumnDataCopy<duckdb::StructValueCopy>(meta_data,source_data,source,offset,copy_count);
  this_00 = ArrayVector::GetEntry(source);
  iVar3 = ArrayType::GetSize(&source->type);
  pVVar4 = ColumnDataMetaData::GetVectorMetaData(meta_data);
  if ((pVVar4->child_index).index == 0xffffffffffffffff) {
    index = ColumnDataCollectionSegment::AllocateVector
                      (this,&this_00->type,meta_data->chunk_data,
                       &meta_data->state->current_chunk_state,(VectorDataIndex)0xffffffffffffffff);
    VVar5 = ColumnDataCollectionSegment::AddChildIndex(meta_data->segment,index);
    pVVar4 = ColumnDataMetaData::GetVectorMetaData(meta_data);
    (pVVar4->child_index).index = VVar5.index;
  }
  pvVar6 = vector<duckdb::ColumnDataCopyFunction,_true>::get<true>
                     (&meta_data->copy_function->child_functions,0);
  pVVar4 = ColumnDataMetaData::GetVectorMetaData(meta_data);
  pvVar7 = vector<duckdb::VectorDataIndex,_true>::get<true>
                     (&this->child_indices,(pVVar4->child_index).index);
  iVar9 = pvVar7->index;
  iVar10 = iVar9;
  while (iVar10 != 0xffffffffffffffff) {
    pvVar8 = vector<duckdb::VectorMetaData,_true>::get<true>(&this->vector_data,iVar10);
    iVar10 = (pvVar8->next_data).index;
  }
  UnifiedVectorFormat::UnifiedVectorFormat(&child_vector_data);
  local_a8.segment = meta_data->segment;
  local_a8.state = meta_data->state;
  local_a8.chunk_data = meta_data->chunk_data;
  local_a8.child_list_size = 0xffffffffffffffff;
  local_a8.copy_function = pvVar6;
  local_a8.vector_data_index.index = iVar9;
  Vector::ToUnifiedFormat(this_00,iVar3 * copy_count,&child_vector_data);
  if ((source_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask !=
      (unsigned_long *)0x0) {
    for (iVar9 = 0; iVar9 != copy_count; iVar9 = iVar9 + 1) {
      iVar10 = offset + iVar9;
      psVar1 = source_data->sel->sel_vector;
      if (psVar1 != (sel_t *)0x0) {
        iVar10 = (idx_t)psVar1[iVar10];
      }
      bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(source_data->validity).super_TemplatedValidityMask<unsigned_long>,iVar10)
      ;
      if (!bVar2) {
        iVar10 = iVar10 * iVar3;
        iVar11 = iVar3;
        while (bVar2 = iVar11 != 0, iVar11 = iVar11 - 1, bVar2) {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&child_vector_data.validity.super_TemplatedValidityMask<unsigned_long>,iVar10);
          iVar10 = iVar10 + 1;
        }
      }
    }
  }
  if (source->vector_type == CONSTANT_VECTOR) {
    while (bVar2 = copy_count != 0, copy_count = copy_count - 1, bVar2) {
      (*pvVar6->function)(&local_a8,&child_vector_data,this_00,0,iVar3);
    }
  }
  else {
    (*pvVar6->function)(&local_a8,&child_vector_data,this_00,iVar3 * offset,iVar3 * copy_count);
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&child_vector_data);
  return;
}

Assistant:

void ColumnDataCopyArray(ColumnDataMetaData &meta_data, const UnifiedVectorFormat &source_data, Vector &source,
                         idx_t offset, idx_t copy_count) {

	auto &segment = meta_data.segment;

	// copy the NULL values for the main array vector (the same as for a struct vector)
	TemplatedColumnDataCopy<StructValueCopy>(meta_data, source_data, source, offset, copy_count);

	auto &child_vector = ArrayVector::GetEntry(source);
	auto &child_type = child_vector.GetType();
	auto array_size = ArrayType::GetSize(source.GetType());

	if (!meta_data.GetVectorMetaData().child_index.IsValid()) {
		auto child_index = segment.AllocateVector(child_type, meta_data.chunk_data, meta_data.state);
		meta_data.GetVectorMetaData().child_index = meta_data.segment.AddChildIndex(child_index);
	}

	auto &child_function = meta_data.copy_function.child_functions[0];
	auto child_index = segment.GetChildIndex(meta_data.GetVectorMetaData().child_index);

	auto current_child_index = child_index;
	while (current_child_index.IsValid()) {
		auto &child_vdata = segment.GetVectorData(current_child_index);
		current_child_index = child_vdata.next_data;
	}

	UnifiedVectorFormat child_vector_data;
	ColumnDataMetaData child_meta_data(child_function, meta_data, child_index);
	child_vector.ToUnifiedFormat(copy_count * array_size, child_vector_data);

	// Broadcast and sync the validity of the array vector to the child vector

	if (source_data.validity.IsMaskSet()) {
		for (idx_t i = 0; i < copy_count; i++) {
			auto source_idx = source_data.sel->get_index(offset + i);
			if (!source_data.validity.RowIsValid(source_idx)) {
				for (idx_t j = 0; j < array_size; j++) {
					child_vector_data.validity.SetInvalid(source_idx * array_size + j);
				}
			}
		}
	}

	auto is_constant = source.GetVectorType() == VectorType::CONSTANT_VECTOR;
	// If the array is constant, we need to copy the child vector n times
	if (is_constant) {
		for (idx_t i = 0; i < copy_count; i++) {
			child_function.function(child_meta_data, child_vector_data, child_vector, 0, array_size);
		}
	} else {
		child_function.function(child_meta_data, child_vector_data, child_vector, offset * array_size,
		                        copy_count * array_size);
	}
}